

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O3

LY_ERR lydjson_get_node_prefix
                 (lyd_node *node,char *param_2,size_t param_3,char **prefix_p,size_t *prefix_len_p)

{
  lysc_node *plVar1;
  lysc_node *in_RAX;
  
  if ((prefix_p == (char **)0x0) || (prefix_len_p == (size_t *)0x0)) {
    __assert_fail("prefix_p && prefix_len_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x9c,
                  "LY_ERR lydjson_get_node_prefix(struct lyd_node *, const char *, size_t, const char **, size_t *)"
                 );
  }
  if (param_3 == 0) {
    for (; (lyd_node_inner *)node != (lyd_node_inner *)0x0;
        node = (lyd_node *)(((lyd_node_inner *)node)->field_0).node.parent) {
      plVar1 = (((lyd_node_inner *)node)->field_0).node.schema;
      if (plVar1 != (lysc_node *)0x0) {
        in_RAX = (lysc_node *)plVar1->module->name;
        *prefix_p = (char *)in_RAX;
        if (in_RAX == (lysc_node *)0x0) goto LAB_0013752c;
LAB_00137545:
        in_RAX = (lysc_node *)strlen((char *)in_RAX);
        param_3 = (size_t)in_RAX;
        goto LAB_00137550;
      }
      in_RAX = (((lyd_node_inner *)((long)node + 0x48))->field_0).node.schema;
      if ((in_RAX != (lysc_node *)0x0) ||
         (in_RAX = *(lysc_node **)&((lyd_node_inner *)((long)node + 0x48))->field_0,
         in_RAX != (lysc_node *)0x0)) {
        *prefix_p = (char *)in_RAX;
        goto LAB_00137545;
      }
      in_RAX = (lysc_node *)0x0;
    }
    *prefix_p = (char *)0x0;
LAB_0013752c:
    param_3 = (size_t)(lysc_node *)0x0;
  }
  else {
    *prefix_p = param_2;
  }
LAB_00137550:
  *prefix_len_p = param_3;
  return (LY_ERR)in_RAX;
}

Assistant:

static LY_ERR
lydjson_get_node_prefix(struct lyd_node *node, const char *local_prefix, size_t local_prefix_len, const char **prefix_p,
        size_t *prefix_len_p)
{
    struct lyd_node_opaq *onode;
    const char *module_name = NULL;

    assert(prefix_p && prefix_len_p);

    if (local_prefix_len) {
        *prefix_p = local_prefix;
        *prefix_len_p = local_prefix_len;
        return LY_SUCCESS;
    }

    while (node) {
        if (node->schema) {
            module_name = node->schema->module->name;
            break;
        }
        onode = (struct lyd_node_opaq *)node;
        if (onode->name.module_name) {
            module_name = onode->name.module_name;
            break;
        } else if (onode->name.prefix) {
            module_name = onode->name.prefix;
            break;
        }
        node = lyd_parent(node);
    }

    *prefix_p = module_name;
    *prefix_len_p = ly_strlen(module_name);
    return LY_SUCCESS;
}